

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_pseudo_mididevice.cpp
# Opt level: O0

bool __thiscall SndSysMIDIDevice::Preprocess(SndSysMIDIDevice *this,MIDIStreamer *song,bool looping)

{
  int iVar1;
  MemoryArrayReader *this_00;
  TArray<unsigned_char,_unsigned_char> *file;
  undefined4 extraout_var;
  undefined8 uVar2;
  MemoryArrayReader *reader;
  bool looping_local;
  MIDIStreamer *song_local;
  SndSysMIDIDevice *this_local;
  
  this_00 = (MemoryArrayReader *)operator_new(0x40);
  MemoryArrayReader::MemoryArrayReader(this_00,(char *)0x0,0);
  file = MemoryArrayReader::GetArray(this_00);
  MIDIStreamer::CreateSMF(song,file,(uint)!looping);
  MemoryArrayReader::UpdateLength(this_00);
  (this->super_PseudoMIDIDevice).bLooping = looping;
  uVar2 = 0;
  if (looping) {
    uVar2 = 0x10;
  }
  iVar1 = (*GSnd->_vptr_SoundRenderer[0xc])(GSnd,this_00,uVar2);
  (this->super_PseudoMIDIDevice).Stream = (SoundStream *)CONCAT44(extraout_var,iVar1);
  return false;
}

Assistant:

bool SndSysMIDIDevice::Preprocess(MIDIStreamer *song, bool looping)
{
    MemoryArrayReader *reader = new MemoryArrayReader(NULL, 0);
    song->CreateSMF(reader->GetArray(), looping ? 0 : 1);
    reader->UpdateLength();

    bLooping = looping;
    Stream = GSnd->OpenStream(reader, looping ? SoundStream::Loop : 0);
    return false;
}